

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O1

Oop __thiscall Lodtalk::VMContext::getGlobalValueFromName(VMContext *this,char *name)

{
  Oop symbol;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  symbol = ByteSymbol::fromNative(this,&local_30);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)getGlobalValueFromSymbol(this,symbol);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (Oop)aVar1.pointer;
}

Assistant:

Oop VMContext::getGlobalValueFromName(const char *name)
{
	return getGlobalValueFromSymbol(ByteSymbol::fromNative(this, name));
}